

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::SetPropertyOnTaggedNumber
               (Var receiver,RecyclableObject *object,PropertyId propertyId,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  ImplicitCallFlags *pIVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *function;
  JavascriptProxy *this;
  undefined1 local_98 [8];
  PropertyValueInfo info;
  RecyclableObject *object_local;
  DescriptorFlags local_3c;
  Var pvStack_38;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  
  info._56_8_ = object;
  bVar3 = VarIs<Js::RecyclableObject>(receiver);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xa3d,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar3) goto LAB_00aab095;
    *puVar5 = 0;
  }
  if (((requestContext->optimizationOverrides).sideEffects & SideEffects_Accessor) !=
      SideEffects_None) {
    pvStack_38 = (Var)0x0;
    local_98 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    local_3c = None;
    if (object == (RecyclableObject *)0x0) {
      GetPropertyObject(receiver,requestContext,(RecyclableObject **)&info.inlineCacheIndex);
      object = (RecyclableObject *)info._56_8_;
    }
    BVar4 = CheckPrototypesForAccessorOrNonWritableProperty
                      (object,propertyId,&stack0xffffffffffffffc8,&local_3c,
                       (PropertyValueInfo *)local_98,requestContext);
    if (BVar4 != 0) {
      if ((local_3c & Accessor) == None) {
        if ((local_3c & Proxy) != None) {
          bVar3 = VarIs<Js::JavascriptProxy>(pvStack_38);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa5a,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                        "VarIs<JavascriptProxy>(setterValueOrProxy)");
            if (!bVar3) goto LAB_00aab095;
            *puVar5 = 0;
          }
          this = VarTo<Js::JavascriptProxy>(pvStack_38);
          BVar4 = JavascriptProxy::SetPropertyTrap
                            (this,receiver,SetPropertyOnTaggedNumberKind,propertyId,newValue,
                             requestContext,propertyOperationFlags,0);
          return BVar4;
        }
        if ((local_3c & WritableData) != Data) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa60,
                                      "((flags & Data) == Data && (flags & Writable) == None)",
                                      "(flags & Data) == Data && (flags & Writable) == None");
          if (!bVar3) {
LAB_00aab095:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      }
      else {
        bVar3 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                          (propertyOperationFlags,pvStack_38,requestContext);
        if (bVar3) {
          return 1;
        }
        if (pvStack_38 != (Var)0x0) {
          function = VarTo<Js::RecyclableObject>(pvStack_38);
          if ((info.m_instance._3_1_ != '\x02') && ((short)info.m_instance != -1)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa53,
                                        "(info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot)"
                                        ,
                                        "info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot"
                                       );
            if (!bVar3) goto LAB_00aab095;
            *puVar5 = 0;
          }
          CallSetter(function,receiver,newValue,requestContext);
          return 1;
        }
      }
    }
  }
  pIVar1 = &requestContext->threadContext->implicitCallFlags;
  *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
  JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetPropertyOnTaggedNumber(Var receiver, RecyclableObject* object, PropertyId propertyId, Var newValue, ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        Assert (TaggedNumber::Is(receiver));

        if (requestContext->optimizationOverrides.GetSideEffects() & SideEffects_Accessor)
        {
            Var setterValueOrProxy = nullptr;
            PropertyValueInfo info;
            DescriptorFlags flags = None;
            if (object == nullptr)
            {
                GetPropertyObject(receiver, requestContext, &object);
            }
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyId, &setterValueOrProxy, &flags, &info, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                        Assert(info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot);
                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                        return TRUE;
                    }
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyOnTaggedNumberKind, propertyId, newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                }
            }
        }

        // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
        requestContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
        return FALSE;
    }